

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# LA32WaveGenerator.cpp
# Opt level: O3

void __thiscall
MT32Emu::LA32WaveGenerator::initPCM
          (LA32WaveGenerator *this,Bit16s *usePCMWaveAddress,Bit32u usePCMWaveLength,
          bool usePCMWaveLooped,bool usePCMWaveInterpolated)

{
  this->pcmWaveAddress = usePCMWaveAddress;
  this->pcmWaveLength = usePCMWaveLength;
  this->pcmWaveLooped = usePCMWaveLooped;
  this->pcmWaveInterpolated = usePCMWaveInterpolated;
  this->wavePosition = 0;
  this->active = true;
  return;
}

Assistant:

void LA32WaveGenerator::initPCM(const Bit16s * const usePCMWaveAddress, const Bit32u usePCMWaveLength, const bool usePCMWaveLooped, const bool usePCMWaveInterpolated) {
	pcmWaveAddress = usePCMWaveAddress;
	pcmWaveLength = usePCMWaveLength;
	pcmWaveLooped = usePCMWaveLooped;
	pcmWaveInterpolated = usePCMWaveInterpolated;

	wavePosition = 0;
	active = true;
}